

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetRuntimeLinkLibrary
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *lang,string *config)

{
  cmMakefile *this_00;
  cmTarget *this_01;
  cmLocalGenerator *lg;
  cmValue config_00;
  bool bVar1;
  string *psVar2;
  string local_1b0;
  string local_190;
  string local_170;
  cmAlphaNum local_150;
  cmAlphaNum local_120;
  string local_f0;
  cmValue local_d0;
  cmValue runtimeLibraryValue;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  cmValue local_30;
  cmValue runtimeLibraryDefault;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *this_local;
  
  this_00 = this->Makefile;
  runtimeLibraryDefault.Value = config;
  cmAlphaNum::cmAlphaNum(&local_80,"CMAKE_");
  cmAlphaNum::cmAlphaNum(&local_b0,lang);
  cmStrCat<char[25]>(&local_50,&local_80,&local_b0,(char (*) [25])0xc53865);
  local_30 = cmMakefile::GetDefinition(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  runtimeLibraryValue.Value = local_30.Value;
  bVar1 = cmNonempty(local_30);
  if (bVar1) {
    this_01 = this->Target;
    cmAlphaNum::cmAlphaNum(&local_120,lang);
    cmAlphaNum::cmAlphaNum(&local_150,"_RUNTIME_LIBRARY");
    cmStrCat<>(&local_f0,&local_120,&local_150);
    local_d0 = cmTarget::GetProperty(this_01,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    bVar1 = cmValue::operator_cast_to_bool(&local_d0);
    if (!bVar1) {
      local_d0.Value = local_30.Value;
    }
    psVar2 = cmValue::operator*[abi_cxx11_(&local_d0);
    std::__cxx11::string::string((string *)&local_190,(string *)psVar2);
    config_00 = runtimeLibraryDefault;
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_1b0);
    cmGeneratorExpression::Evaluate
              (&local_170,&local_190,lg,config_00.Value,this,(cmGeneratorExpressionDAGChecker *)0x0,
               (cmGeneratorTarget *)0x0,&local_1b0);
    cmsys::SystemTools::UpperCase(__return_storage_ptr__,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetRuntimeLinkLibrary(
  std::string const& lang, std::string const& config) const
{
  // This is activated by the presence of a default selection whether or
  // not it is overridden by a property.
  cmValue runtimeLibraryDefault = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_RUNTIME_LIBRARY_DEFAULT"));
  if (!cmNonempty(runtimeLibraryDefault)) {
    return std::string();
  }
  cmValue runtimeLibraryValue =
    this->Target->GetProperty(cmStrCat(lang, "_RUNTIME_LIBRARY"));
  if (!runtimeLibraryValue) {
    runtimeLibraryValue = runtimeLibraryDefault;
  }
  return cmSystemTools::UpperCase(cmGeneratorExpression::Evaluate(
    *runtimeLibraryValue, this->LocalGenerator, config, this));
}